

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

cmList * __thiscall
cmList::sublist(cmList *__return_storage_ptr__,cmList *this,size_type pos,size_type length)

{
  pointer pbVar1;
  ulong uVar2;
  out_of_range *this_00;
  ulong uVar3;
  size_type pos_local;
  unsigned_long local_40;
  string local_38;
  
  pbVar1 = (this->Values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->Values).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  pos_local = pos;
  if (pos < uVar3) {
    uVar2 = length + pos;
    if (uVar3 <= length + pos) {
      uVar2 = uVar3;
    }
    if (length == 0xffffffffffffffff) {
      uVar2 = uVar3;
    }
    sublist(__return_storage_ptr__,this,pbVar1 + pos,pbVar1 + uVar2);
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  local_40 = ((long)(this->Values).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->Values).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
  cmStrCat<char_const(&)[14],unsigned_long&,char_const(&)[22],unsigned_long>
            (&local_38,(char (*) [14])"begin index: ",&pos_local,
             (char (*) [22])" is out of range 0 - ",&local_40);
  std::out_of_range::out_of_range(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

cmList cmList::sublist(size_type pos, size_type length) const
{
  if (pos >= this->Values.size()) {
    throw std::out_of_range(cmStrCat(
      "begin index: ", pos, " is out of range 0 - ", this->Values.size() - 1));
  }

  size_type count = (length == npos || pos + length > this->size())
    ? this->size()
    : pos + length;
  return this->sublist(this->begin() + pos, this->begin() + count);
}